

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O2

Terminator * __thiscall soul::Optimisations::Inliner::cloneTerminator(Inliner *this,Terminator *s)

{
  int iVar1;
  Branch *__fn;
  undefined4 extraout_var;
  BranchIf *__fn_00;
  undefined4 extraout_var_00;
  ReturnVoid *__fn_01;
  undefined4 extraout_var_01;
  ReturnValue *__fn_02;
  undefined4 extraout_var_02;
  int in_ECX;
  void *__child_stack;
  void *__child_stack_00;
  void *__child_stack_01;
  void *__child_stack_02;
  void *in_R8;
  pool_ptr<const_soul::heart::Branch> t;
  pool_ptr<const_soul::heart::BranchIf> local_20;
  Terminator *pTVar2;
  
  cast<soul::heart::Branch_const,soul::heart::Terminator>((soul *)&local_20,s);
  if (local_20.object == (BranchIf *)0x0) {
    cast<soul::heart::BranchIf_const,soul::heart::Terminator>((soul *)&local_20,s);
    if (local_20.object == (BranchIf *)0x0) {
      cast<soul::heart::ReturnVoid_const,soul::heart::Terminator>((soul *)&local_20,s);
      if (local_20.object == (BranchIf *)0x0) {
        cast<soul::heart::ReturnValue_const,soul::heart::Terminator>((soul *)&local_20,s);
        if (local_20.object == (BranchIf *)0x0) {
          throwInternalCompilerError("cloneTerminator",0x26a);
        }
        __fn_02 = pool_ptr<const_soul::heart::ReturnValue>::operator*
                            ((pool_ptr<const_soul::heart::ReturnValue> *)&local_20);
        iVar1 = clone(this,(__fn *)__fn_02,__child_stack_02,in_ECX,in_R8);
        pTVar2 = (Terminator *)CONCAT44(extraout_var_02,iVar1);
      }
      else {
        __fn_01 = pool_ptr<const_soul::heart::ReturnVoid>::operator*
                            ((pool_ptr<const_soul::heart::ReturnVoid> *)&local_20);
        iVar1 = clone(this,(__fn *)__fn_01,__child_stack_01,in_ECX,in_R8);
        pTVar2 = (Terminator *)CONCAT44(extraout_var_01,iVar1);
      }
    }
    else {
      __fn_00 = pool_ptr<const_soul::heart::BranchIf>::operator*(&local_20);
      iVar1 = clone(this,(__fn *)__fn_00,__child_stack_00,in_ECX,in_R8);
      pTVar2 = (Terminator *)CONCAT44(extraout_var_00,iVar1);
    }
  }
  else {
    __fn = pool_ptr<const_soul::heart::Branch>::operator*
                     ((pool_ptr<const_soul::heart::Branch> *)&local_20);
    iVar1 = clone(this,(__fn *)__fn,__child_stack,in_ECX,in_R8);
    pTVar2 = (Terminator *)CONCAT44(extraout_var,iVar1);
  }
  return pTVar2;
}

Assistant:

heart::Terminator& cloneTerminator (heart::Terminator& s)
        {
            #define SOUL_CLONE_TERMINATOR(Type)    if (auto t = cast<const heart::Type> (s)) return clone (*t);
            SOUL_HEART_TERMINATORS (SOUL_CLONE_TERMINATOR)
            #undef SOUL_CLONE_TERMINATOR
            SOUL_ASSERT_FALSE;
            return s;
        }